

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

unique_ptr<MSX::Machine,_std::default_delete<MSX::Machine>_> __thiscall
MSX::Machine::MSX(Machine *this,Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *local_68;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *local_28;
  Target *msx_target;
  ROMFetcher *rom_fetcher_local;
  Target *target_local;
  
  msx_target = (Target *)rom_fetcher;
  rom_fetcher_local = (ROMFetcher *)target;
  target_local = (Target *)this;
  if (target == (Target *)0x0) {
    local_68 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)0x0;
  }
  else {
    local_68 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
                *)__dynamic_cast(target,&Analyser::Static::Target::typeinfo,
                                 &Analyser::Static::MSX::Target::typeinfo,0);
  }
  local_28 = local_68;
  if (((local_68[4].super__Function_base._M_functor._M_pod_data + 8)[1] & 1U) == 0) {
    iVar1 = *(int *)&local_68[5].super__Function_base._M_manager;
    if (iVar1 == 0) {
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,false>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)(local_48 + 8),local_68);
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,false>,std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,false>>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,
                 (unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>_>_>
                  *)(local_48 + 8));
      std::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>_>_>
      ::~unique_ptr((unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>_>_>
                     *)(local_48 + 8));
    }
    else if (iVar1 == 1) {
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)local_48,local_68);
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false>,std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,false>>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,
                 (unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>_>_>
                  *)local_48);
      std::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>_>_>
      ::~unique_ptr((unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_false>_>_>
                     *)local_48);
    }
    else {
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<std::default_delete<MSX::Machine>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,(nullptr_t)0x0);
    }
  }
  else {
    iVar1 = *(int *)&local_68[5].super__Function_base._M_manager;
    if (iVar1 == 0) {
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)(local_38 + 8),local_68);
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true>,std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,true>>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,
                 (unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>_>_>
                  *)(local_38 + 8));
      std::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>_>_>
      ::~unique_ptr((unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>_>_>
                     *)(local_38 + 8));
    }
    else if (iVar1 == 1) {
      std::
      make_unique<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true>,Analyser::Static::MSX::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
                ((Target *)local_38,local_68);
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true>,std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,true>>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,
                 (unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>_>_>
                  *)local_38);
      std::
      unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>_>_>
      ::~unique_ptr((unique_ptr<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>,_std::default_delete<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)1,_true>_>_>
                     *)local_38);
    }
    else {
      std::unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>>::
      unique_ptr<std::default_delete<MSX::Machine>,void>
                ((unique_ptr<MSX::Machine,std::default_delete<MSX::Machine>> *)this,(nullptr_t)0x0);
    }
  }
  return (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)
         (__uniq_ptr_data<MSX::Machine,_std::default_delete<MSX::Machine>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Machine> Machine::MSX(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const auto msx_target = dynamic_cast<const Target *>(target);
	if(msx_target->has_msx_music) {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, true>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, true>>(*msx_target, rom_fetcher);
		}
	} else {
		switch(msx_target->model) {
			default: 					return nullptr;
			case Target::Model::MSX1:	return std::make_unique<ConcreteMachine<Target::Model::MSX1, false>>(*msx_target, rom_fetcher);
			case Target::Model::MSX2:	return std::make_unique<ConcreteMachine<Target::Model::MSX2, false>>(*msx_target, rom_fetcher);
		}
	}
}